

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O2

void __thiscall
FastVector<ExternFuncInfo,_false,_false>::grow_and_add
          (FastVector<ExternFuncInfo,_false,_false> *this,uint newSize,ExternFuncInfo *val)

{
  uint uVar1;
  ExternFuncInfo *pEVar2;
  
  pEVar2 = this->data;
  grow_no_destroy(this,newSize);
  uVar1 = this->count;
  this->count = uVar1 + 1;
  memcpy(this->data + uVar1,val,0x94);
  if (pEVar2 != (ExternFuncInfo *)0x0) {
    (*(code *)NULLC::dealloc)(pEVar2);
    return;
  }
  return;
}

Assistant:

void grow_and_add(unsigned newSize, const T& val)
	{
		T* oldData = data;
		unsigned oldMax = max;

		grow_no_destroy(newSize);

		data[count++] = val;

		if(oldData)
		{
			if(!skipConstructor)
				NULLC::destruct(oldData, oldMax);
			else
				NULLC::alignedDealloc(oldData);
		}
	}